

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

from_chars_result __thiscall
semver::detail::version_parser::parse<long,long,long>
          (version_parser *this,version<long,_long,_long> *out)

{
  from_chars_result fVar1;
  bool bVar2;
  token *ptVar3;
  char *pcVar4;
  from_chars_result fVar5;
  
  version<long,_long,_long>::clear(out);
  fVar5 = (from_chars_result)parse_number<long>(this,&out->major_);
  if (fVar5.ec != 0) {
    return (from_chars_result)fVar5;
  }
  ptVar3 = token_stream::advance(this->stream);
  if ((char)ptVar3 == '\x02') {
    fVar5 = (from_chars_result)parse_number<long>(this,&out->minor_);
    if (fVar5.ec != 0) {
      return (from_chars_result)fVar5;
    }
    ptVar3 = token_stream::advance(this->stream);
    if ((char)ptVar3 == '\x02') {
      fVar5 = (from_chars_result)parse_number<long>(this,&out->patch_);
      pcVar4 = fVar5.ptr;
      if (fVar5.ec != 0) {
        return (from_chars_result)fVar5;
      }
      bVar2 = token_stream::advanceIfMatch(this->stream,hyphen);
      if (bVar2) {
        fVar5 = (from_chars_result)
                parse_prerelease_tag(this,&out->prerelease_tag_,&out->prerelease_identifiers);
        pcVar4 = fVar5.ptr;
        if (fVar5.ec != 0) {
          return (from_chars_result)fVar5;
        }
      }
      bVar2 = token_stream::advanceIfMatch(this->stream,plus);
      fVar5._8_8_ = 0;
      fVar5.ptr = pcVar4;
      if (!bVar2) {
        return (from_chars_result)fVar5;
      }
      fVar5 = (from_chars_result)parse_build_metadata(this,&out->build_metadata_);
      return (from_chars_result)fVar5;
    }
  }
  fVar1._8_8_ = 0x16;
  fVar1.ptr = (this->stream->tokens).
              super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
              _M_impl.super__Vector_impl_data._M_start[this->stream->current - 1].lexeme;
  return (from_chars_result)fVar1;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(version<I1, I2, I3>& out) noexcept {
    out.clear();

    from_chars_result result = parse_number(out.major_); 
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.minor_);
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.patch_);
    if (!result) {
      return result;
    }

    if (stream.advanceIfMatch(token_type::hyphen)) {
      result = parse_prerelease_tag(out.prerelease_tag_, out.prerelease_identifiers);
      if (!result) {
        return result;
      }
    }

    if (stream.advanceIfMatch(token_type::plus)) {
      result = parse_build_metadata(out.build_metadata_);
      if (!result) {
        return result;
      }
    }

    return result;
  }